

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O3

void __thiscall QPDFOutlineDocumentHelper::initializeByPage(QPDFOutlineDocumentHelper *this)

{
  QPDFOutlineObjectHelper *__x;
  element_type *peVar1;
  _List_node_base *p_Var2;
  mapped_type *this_00;
  list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> queue;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> kids;
  QPDFOutlineObjectHelper oh;
  _List_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_a8;
  QPDFOutlineDocumentHelper *local_90;
  undefined1 local_88 [40];
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node._M_size = 0;
  peVar1 = (this->m).
           super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_90 = this;
  std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
  insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
            ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)&local_a8,
             (_List_node_base *)&local_a8,
             (peVar1->outlines).
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (peVar1->outlines).
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_a8) {
    __x = (QPDFOutlineObjectHelper *)(local_88 + 0x20);
    do {
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
      local_60 = (element_type *)local_a8._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
      local_58._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_a8._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
        }
      }
      local_50 = local_a8._M_impl._M_node.super__List_node_base._M_next[2]._M_prev;
      local_48 = local_a8._M_impl._M_node.super__List_node_base._M_next[3]._M_next;
      if (local_48 != (_List_node_base *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_48->_M_prev = *(int *)&local_48->_M_prev + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_48->_M_prev = *(int *)&local_48->_M_prev + 1;
        }
      }
      local_88._32_8_ = &PTR__QPDFOutlineObjectHelper_002f0d40;
      local_40 = local_a8._M_impl._M_node.super__List_node_base._M_next[3]._M_prev;
      local_38 = local_a8._M_impl._M_node.super__List_node_base._M_next[4]._M_next;
      if (local_38 != (_List_node_base *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_38->_M_prev = *(int *)&local_38->_M_prev + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_38->_M_prev = *(int *)&local_38->_M_prev + 1;
        }
      }
      local_a8._M_impl._M_node._M_size = local_a8._M_impl._M_node._M_size - 1;
      std::__detail::_List_node_base::_M_unhook();
      (*(code *)(p_Var2[1]._M_next)->_M_next)(p_Var2 + 1);
      operator_delete(p_Var2,0x48);
      peVar1 = (local_90->m).
               super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      QPDFOutlineObjectHelper::getDestPage((QPDFOutlineObjectHelper *)local_88);
      local_88._24_8_ = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_88);
      this_00 = std::
                map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
                ::operator[](&peVar1->by_page,(key_type *)(local_88 + 0x18));
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
                (this_00,__x);
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      QPDFOutlineObjectHelper::getKids
                ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                 local_88,__x);
      std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
      insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
                ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)&local_a8,
                 (_List_node_base *)&local_a8,
                 (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                  )local_88._0_8_,
                 (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                  )local_88._8_8_);
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                 local_88);
      QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(__x);
    } while (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_a8)
    ;
  }
  std::__cxx11::_List_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
  _M_clear(&local_a8);
  return;
}

Assistant:

void
QPDFOutlineDocumentHelper::initializeByPage()
{
    std::list<QPDFOutlineObjectHelper> queue;
    queue.insert(queue.end(), m->outlines.begin(), m->outlines.end());

    while (!queue.empty()) {
        QPDFOutlineObjectHelper oh = queue.front();
        queue.pop_front();
        m->by_page[oh.getDestPage().getObjGen()].push_back(oh);
        std::vector<QPDFOutlineObjectHelper> kids = oh.getKids();
        queue.insert(queue.end(), kids.begin(), kids.end());
    }
}